

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

PacketBuilder * __thiscall
PacketBuilder::AddBreakString(PacketBuilder *this,string *str,uchar breakchar)

{
  long lVar1;
  string tempstr;
  long local_38 [4];
  
  std::__cxx11::string::string((string *)local_38,(string *)str);
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)local_38,(ulong)(uint)(int)(char)breakchar);
    if (lVar1 == -1) break;
    *(undefined1 *)(local_38[0] + lVar1) = 0x79;
  }
  std::__cxx11::string::append((string *)&this->data);
  std::__cxx11::string::push_back((char)&this->data);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddBreakString(const std::string &str, unsigned char breakchar)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	std::string tempstr(str);
	std::size_t breakin = tempstr.find_first_of(breakchar);

	while (breakin != std::string::npos)
	{
		tempstr[breakin] = 'y';
		breakin = tempstr.find_first_of(breakchar, breakin+1);
	}

	this->data += tempstr;
	this->data += breakchar;


#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}